

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 4_function_override.cpp
# Opt level: O3

char * do_left(char *str,uint ct)

{
  char *__dest;
  ulong __n;
  
  __dest = (char *)operator_new__((ulong)(ct + 1));
  if (ct == 0) {
    __n = 0;
  }
  else {
    __n = (ulong)ct;
    memcpy(__dest,str,__n);
  }
  __dest[__n] = '\0';
  return __dest;
}

Assistant:

char * do_left(const char * str, unsigned ct) {
    char * result = new char[ct + 1];// prepare last \0
    int i = 0;
    for (i; i < ct; i++) {
        result[i] = str[i];
    }
    while(i <= ct) {
        result[i++] = '\0';
    }
    return result;
}